

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plane.cpp
# Opt level: O0

bool __thiscall Plane::intersect(Plane *this,Ray *r,double *t)

{
  double dVar1;
  double dVar2;
  double vd;
  double *t_local;
  Ray *r_local;
  Plane *this_local;
  
  PlaneTestCount = PlaneTestCount + 1;
  dVar1 = operator&(&this->normal,&r->dir);
  if ((dVar1 <= -0.01) || (0.01 <= dVar1)) {
    dVar2 = operator&(&this->normal,&r->org);
    *t = -(dVar2 + this->dist) / dVar1;
    if (*t <= geom_threshold) {
      PlaneTestMisses = PlaneTestMisses + 1;
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    PlaneTestMisses = PlaneTestMisses + 1;
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Plane::intersect(Ray& r, double& t)
{
   STAT( PlaneTestCount++  );

   double vd = normal & r.dir;

   if(   vd > -EPS && vd   < EPS )
   {
      STAT( PlaneTestMisses++ );
      return false;
   }

   t =   -((normal & r.org) + dist) / vd;

   if(   t >   geom_threshold )
      return true;
   else
   {
      STAT(PlaneTestMisses++);
      return false;
   }
}